

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TPZEqnArray<float>_*,_10>::~TPZManVector(TPZManVector<TPZEqnArray<float>_*,_10> *this)

{
  TPZVec<TPZEqnArray<float>_*> *in_RDI;
  
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZManVector_02564010;
  if ((TPZVec<TPZEqnArray<float>_*> *)in_RDI->fStore == in_RDI + 1) {
    in_RDI->fStore = (TPZEqnArray<float> **)0x0;
  }
  in_RDI->fNAlloc = 0;
  TPZVec<TPZEqnArray<float>_*>::~TPZVec(in_RDI);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}